

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicstransform.cpp
# Opt level: O2

void __thiscall QGraphicsRotation::applyTo(QGraphicsRotation *this,QMatrix4x4 *matrix)

{
  long lVar1;
  long lVar2;
  bool bVar3;
  char cVar4;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  lVar2 = *(long *)(this + 8);
  if ((*(double *)(lVar2 + 0x90) != 0.0) || (NAN(*(double *)(lVar2 + 0x90)))) {
    bVar3 = QVector3D::isNull((QVector3D *)(lVar2 + 0x98));
    if (!bVar3) {
      cVar4 = qIsNaN(*(double *)(lVar2 + 0x90));
      if (cVar4 == '\0') {
        QMatrix4x4::translate((QVector3D *)matrix);
        QMatrix4x4::projectedRotate
                  ((float)*(double *)(lVar2 + 0x90),*(float *)(lVar2 + 0x98),
                   *(float *)(lVar2 + 0x9c),*(float *)(lVar2 + 0xa0));
        QMatrix4x4::translate((QVector3D *)matrix);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QGraphicsRotation::applyTo(QMatrix4x4 *matrix) const
{
    Q_D(const QGraphicsRotation);

    if (d->angle == 0. || d->axis.isNull() || qIsNaN(d->angle))
        return;

    matrix->translate(d->origin);
    matrix->projectedRotate(d->angle, d->axis.x(), d->axis.y(), d->axis.z());
    matrix->translate(-d->origin);
}